

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_read_int8_array
              (coda_cursor_conflict *cursor,int8_t *dst,coda_array_ordering array_ordering)

{
  coda_dynamic_type_struct *pcVar1;
  int iVar2;
  coda_mem_type *type;
  coda_array_ordering array_ordering_local;
  int8_t *dst_local;
  coda_cursor_conflict *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  if (pcVar1[1].backend == coda_backend_binary) {
    cursor_local._4_4_ = read_array(cursor,coda_cursor_read_int8,(uint8_t *)dst,1,array_ordering);
  }
  else {
    if (pcVar1[1].backend != 2) {
      __assert_fail("type->tag == tag_mem_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x28b,
                    "int coda_mem_cursor_read_int8_array(const coda_cursor *, int8_t *, coda_array_ordering)"
                   );
    }
    if (**(int **)(pcVar1->definition + 1) == 1) {
      cursor_local._4_4_ =
           read_array(cursor,coda_bin_cursor_read_int8,(uint8_t *)dst,1,array_ordering);
    }
    else {
      if (**(int **)(pcVar1->definition + 1) != 0) {
        __assert_fail("((coda_type_array *)type->definition)->base_type->format == coda_format_ascii"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                      ,0x291,
                      "int coda_mem_cursor_read_int8_array(const coda_cursor *, int8_t *, coda_array_ordering)"
                     );
      }
      iVar2 = read_array(cursor,coda_ascii_cursor_read_int8,(uint8_t *)dst,1,coda_array_ordering_c);
      if (iVar2 == 0) {
        if ((array_ordering == coda_array_ordering_c) ||
           (iVar2 = transpose_array(cursor,dst,1), iVar2 == 0)) {
          cursor_local._4_4_ = 0;
        }
        else {
          cursor_local._4_4_ = -1;
        }
      }
      else {
        cursor_local._4_4_ = -1;
      }
    }
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_mem_cursor_read_int8_array(const coda_cursor *cursor, int8_t *dst, coda_array_ordering array_ordering)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_array)
    {
        return read_array(cursor, (read_function)&coda_cursor_read_int8, (uint8_t *)dst, sizeof(int8_t),
                          array_ordering);
    }
    assert(type->tag == tag_mem_data);
    if (((coda_type_array *)type->definition)->base_type->format == coda_format_binary)
    {
        return read_array(cursor, (read_function)&coda_bin_cursor_read_int8, (uint8_t *)dst, sizeof(int8_t),
                          array_ordering);
    }
    assert(((coda_type_array *)type->definition)->base_type->format == coda_format_ascii);
    if (read_array(cursor, (read_function)&coda_ascii_cursor_read_int8, (uint8_t *)dst, sizeof(int8_t),
                   coda_array_ordering_c) != 0)
    {
        return -1;
    }
    if (array_ordering != coda_array_ordering_c)
    {
        if (transpose_array(cursor, dst, sizeof(int8_t)) != 0)
        {
            return -1;
        }
    }
    return 0;
}